

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

bool doctest::detail::parseOptionImpl(int argc,char **argv,char *pattern,String *res)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  String local_58;
  int local_4c;
  char *pcStack_48;
  uint len;
  char *curr;
  char *pcStack_38;
  bool noBadCharsFound;
  char *temp;
  String *pSStack_28;
  int i;
  String *res_local;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  temp._4_4_ = argc + -1;
  pSStack_28 = res;
  res_local = (String *)pattern;
  pattern_local = (char *)argv;
  argv_local._0_4_ = argc;
  do {
    if (temp._4_4_ < 0) {
      return false;
    }
    pcStack_38 = strstr(*(char **)(pattern_local + (long)temp._4_4_ * 8),(char *)res_local);
    if (pcStack_38 != (char *)0x0) {
      curr._7_1_ = '\x01';
      pcStack_48 = *(char **)(pattern_local + (long)temp._4_4_ * 8);
      do {
        if (pcStack_48 == pcStack_38) goto LAB_0010af6b;
        pcVar3 = pcStack_48 + 1;
        cVar1 = *pcStack_48;
        pcStack_48 = pcVar3;
      } while (cVar1 == '-');
      curr._7_1_ = '\0';
LAB_0010af6b:
      if ((curr._7_1_ != '\0') && (**(char **)(pattern_local + (long)temp._4_4_ * 8) == '-')) {
        sVar2 = my_strlen((char *)res_local);
        pcStack_38 = pcStack_38 + sVar2;
        sVar2 = my_strlen(pcStack_38);
        local_4c = (int)sVar2;
        if (local_4c != 0) {
          String::String(&local_58,pcStack_38);
          String::operator=(pSStack_28,&local_58);
          String::~String(&local_58);
          return true;
        }
        local_4c = 0;
      }
    }
    temp._4_4_ = temp._4_4_ + -1;
  } while( true );
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String& res) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp) {
                // eliminate matches in which the chars before the option are not '-'
                bool        noBadCharsFound = true;
                const char* curr            = argv[i];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-') {
                    temp += my_strlen(pattern);
                    unsigned len = my_strlen(temp);
                    if(len) {
                        res = temp;
                        return true;
                    }
                }
            }
        }
        return false;
    }